

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngineDriver.cpp
# Opt level: O0

int main(void)

{
  ulong uVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  GameLoop *pGVar4;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar5;
  size_type sVar6;
  reference ppPVar7;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar8;
  reference ppCVar9;
  Map *pMVar10;
  Deck *this;
  int *piVar11;
  void *pvVar12;
  string local_40;
  ulong local_20;
  unsigned_long j;
  unsigned_long i;
  
  i._4_4_ = 0;
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "------------ Running the game start phase --------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  std::operator<<((ostream *)&std::cout,"\n");
  GameLoop::startSingle(true);
  j = 0;
  while( true ) {
    uVar2 = j;
    pGVar4 = GameLoop::getInstance();
    pvVar5 = GameLoop::getAllPlayers(pGVar4);
    sVar6 = std::vector<Player_*,_std::allocator<Player_*>_>::size(pvVar5);
    if (sVar6 <= uVar2) break;
    local_20 = 0;
    while( true ) {
      uVar1 = local_20;
      pGVar4 = GameLoop::getInstance();
      pvVar5 = GameLoop::getAllPlayers(pGVar4);
      ppPVar7 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar5,j);
      pvVar8 = Player::getOwnedCountries(*ppPVar7);
      sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar8);
      if (sVar6 <= uVar1) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"player ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,j);
      poVar3 = std::operator<<(poVar3," owns country : ");
      pGVar4 = GameLoop::getInstance();
      pvVar5 = GameLoop::getAllPlayers(pGVar4);
      ppPVar7 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pvVar5,j);
      pvVar8 = Player::getOwnedCountries(*ppPVar7);
      ppCVar9 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar8,local_20);
      Map::Country::getCountryName_abi_cxx11_(&local_40,*ppCVar9);
      poVar3 = std::operator<<(poVar3,(string *)&local_40);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_40);
      local_20 = local_20 + 1;
    }
    j = j + 1;
  }
  std::operator<<((ostream *)&std::cout,"\nprint map to compare with output of start : \n");
  pGVar4 = GameLoop::getInstance();
  pMVar10 = GameLoop::getGameMap(pGVar4);
  Map::printMap(pMVar10);
  std::operator<<((ostream *)&std::cout,"\n\n\x1b[34m");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-------------------------- Deck ------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of cards in the deck: ");
  pGVar4 = GameLoop::getInstance();
  this = GameLoop::getGameDeck(pGVar4);
  piVar11 = Deck::getNumberOfCards(this);
  pvVar12 = (void *)std::ostream::operator<<(poVar3,*piVar11);
  std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of countries in the map: ");
  pGVar4 = GameLoop::getInstance();
  pMVar10 = GameLoop::getGameMap(pGVar4);
  pvVar8 = Map::getMapCountries(pMVar10);
  sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar8);
  pvVar12 = (void *)std::ostream::operator<<(poVar3,sVar6);
  std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\n\n\x1b[34m");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "------------------ Distributing armies -----------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  pGVar4 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar4);
  std::operator<<((ostream *)&std::cout,"\nprint map to see where armies went : \n");
  pGVar4 = GameLoop::getInstance();
  pMVar10 = GameLoop::getGameMap(pGVar4);
  Map::printMap(pMVar10);
  std::operator<<((ostream *)&std::cout,"\n\n\x1b[34m");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------- Running the main game loop -------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  pGVar4 = GameLoop::getInstance();
  GameLoop::loop(pGVar4,200);
  GameLoop::resetInstance();
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running the game start phase --------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "\n";

    GameLoop::startSingle(true);

    for (unsigned long i = 0; i < GameLoop::getInstance()->getAllPlayers()->size(); i++) {
        for (unsigned long j = 0;
             j < GameLoop::getInstance()->getAllPlayers()->at(i)->getOwnedCountries()->size(); j++) {
            cout << "player " << i << " owns country : "
                 << GameLoop::getInstance()->getAllPlayers()->at(i)->getOwnedCountries()->at(j)->getCountryName()
                 << "\n";
        }
    }

    cout << "\nprint map to compare with output of start : \n";

    GameLoop::getInstance()->getGameMap()->printMap();

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "-------------------------- Deck ------------------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "Number of cards in the deck: " << *GameLoop::getInstance()->getGameDeck()->getNumberOfCards() << endl;
    cout << "Number of countries in the map: " << GameLoop::getInstance()->getGameMap()->getMapCountries()->size()
         << endl;

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------------ Distributing armies -----------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    GameLoop::getInstance()->distributeArmies();

    cout << "\nprint map to see where armies went : \n";

    GameLoop::getInstance()->getGameMap()->printMap();

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "--------------- Running the main game loop -------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    GameLoop::getInstance()->loop(200);
    GameLoop::resetInstance();
    return 0;
}